

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v4.cpp
# Opt level: O2

ssize_t __thiscall
LASreadItemCompressed_RGB14_v4::read
          (LASreadItemCompressed_RGB14_v4 *this,int __fd,void *__buf,size_t __nbytes)

{
  ushort uVar1;
  U32 UVar2;
  U32 UVar3;
  uint uVar4;
  uint uVar5;
  ushort uVar6;
  uint uVar7;
  undefined4 in_register_00000034;
  uint *puVar8;
  ulong uVar9;
  int iVar10;
  U16 *item;
  
  puVar8 = (uint *)CONCAT44(in_register_00000034,__fd);
  uVar4 = this->current_context;
  item = this->contexts[uVar4].last_item;
  uVar7 = *__buf;
  uVar9 = (ulong)uVar7;
  if (uVar4 != uVar7) {
    this->current_context = uVar7;
    if (this->contexts[uVar9].unused == true) {
      createAndInitModelsAndDecompressors(this,uVar7,(U8 *)item);
      uVar9 = (ulong)this->current_context;
    }
    uVar4 = (uint)uVar9;
    item = this->contexts[uVar9].last_item;
  }
  if (this->changed_RGB == true) {
    UVar2 = ArithmeticDecoder::decodeSymbol(this->dec_RGB,this->contexts[uVar4].m_byte_used);
    if ((UVar2 & 1) == 0) {
      uVar7 = (uint)(byte)*item;
    }
    else {
      UVar3 = ArithmeticDecoder::decodeSymbol
                        (this->dec_RGB,this->contexts[this->current_context].m_rgb_diff_0);
      uVar4 = (UVar3 & 0xff) + (uint)(byte)*item;
      uVar7 = ((UVar3 & 0xff) - 0x100) + (uint)(byte)*item;
      if (uVar4 < 0x100) {
        uVar7 = uVar4;
      }
    }
    *(ushort *)puVar8 = (ushort)uVar7;
    if ((UVar2 & 2) == 0) {
      uVar6 = *item;
    }
    else {
      UVar3 = ArithmeticDecoder::decodeSymbol
                        (this->dec_RGB,this->contexts[this->current_context].m_rgb_diff_1);
      uVar7 = (uint)(ushort)*puVar8;
      uVar6 = (short)(UVar3 << 8) + *item;
    }
    uVar6 = (ushort)uVar7 | uVar6 & 0xff00;
    *(ushort *)puVar8 = uVar6;
    if ((UVar2 & 0x40) == 0) {
      *(ushort *)((long)puVar8 + 2) = uVar6;
      *(ushort *)(puVar8 + 1) = uVar6;
    }
    else {
      iVar10 = (uVar7 & 0xff) - (uint)(byte)*item;
      if ((UVar2 & 4) == 0) {
        uVar6 = (ushort)(byte)item[1];
      }
      else {
        UVar3 = ArithmeticDecoder::decodeSymbol
                          (this->dec_RGB,this->contexts[this->current_context].m_rgb_diff_2);
        uVar7 = (uint)(byte)item[1] + iVar10;
        uVar4 = uVar7 & 0xff;
        if (0xfe < (int)uVar7) {
          uVar4 = 0xff;
        }
        uVar5 = 0;
        if (0 < (int)uVar7) {
          uVar5 = uVar4;
        }
        uVar4 = uVar5 + (UVar3 & 0xff);
        uVar6 = (short)uVar5 + -0x100 + (short)(UVar3 & 0xff);
        if (uVar4 < 0x100) {
          uVar6 = (ushort)uVar4;
        }
      }
      *(ushort *)((long)puVar8 + 2) = uVar6;
      if ((UVar2 & 0x10) == 0) {
        uVar1 = (ushort)(byte)item[2];
      }
      else {
        UVar3 = ArithmeticDecoder::decodeSymbol
                          (this->dec_RGB,this->contexts[this->current_context].m_rgb_diff_4);
        uVar6 = *(ushort *)((long)puVar8 + 2);
        uVar4 = ((uVar6 & 0xff) + iVar10) - (uint)(byte)item[1];
        uVar7 = (uint)(byte)item[2] +
                (int)(short)((int)((uint)(ushort)((short)uVar4 >> 0xf) << 0x10 | uVar4 & 0xffff) / 2
                            );
        uVar4 = uVar7 & 0xff;
        if (0xfe < (int)uVar7) {
          uVar4 = 0xff;
        }
        uVar5 = 0;
        if (0 < (int)uVar7) {
          uVar5 = uVar4;
        }
        uVar4 = uVar5 + (UVar3 & 0xff);
        uVar1 = (short)uVar5 + -0x100 + (short)(UVar3 & 0xff);
        if (uVar4 < 0x100) {
          uVar1 = (ushort)uVar4;
        }
      }
      *(ushort *)(puVar8 + 1) = uVar1;
      iVar10 = (uint)*(byte *)((long)puVar8 + 1) - (uint)*(byte *)((long)item + 1);
      if ((UVar2 & 8) == 0) {
        uVar6 = uVar6 | (ushort)*(byte *)((long)item + 3) << 8;
      }
      else {
        UVar3 = ArithmeticDecoder::decodeSymbol
                          (this->dec_RGB,this->contexts[this->current_context].m_rgb_diff_3);
        uVar7 = (uint)*(byte *)((long)item + 3) + iVar10;
        uVar4 = uVar7 & 0xff;
        if (0xfe < (int)uVar7) {
          uVar4 = 0xff;
        }
        uVar5 = 0;
        if (0 < (int)uVar7) {
          uVar5 = uVar4;
        }
        uVar4 = uVar5 + (UVar3 & 0xff);
        uVar7 = (uVar5 - 0x100) + (UVar3 & 0xff);
        if (uVar4 < 0x100) {
          uVar7 = uVar4;
        }
        uVar6 = (ushort)(uVar7 << 8) | *(ushort *)((long)puVar8 + 2);
      }
      *(ushort *)((long)puVar8 + 2) = uVar6;
      if ((UVar2 & 0x20) == 0) {
        *(ushort *)(puVar8 + 1) = (ushort)puVar8[1] | (ushort)*(byte *)((long)item + 5) << 8;
      }
      else {
        UVar2 = ArithmeticDecoder::decodeSymbol
                          (this->dec_RGB,this->contexts[this->current_context].m_rgb_diff_5);
        uVar4 = ((uint)*(byte *)((long)puVar8 + 3) + iVar10) - (uint)*(byte *)((long)item + 3);
        uVar7 = (uint)*(byte *)((long)item + 5) +
                (int)(short)((int)((uint)(ushort)((short)uVar4 >> 0xf) << 0x10 | uVar4 & 0xffff) / 2
                            );
        uVar4 = uVar7 & 0xff;
        if (0xfe < (int)uVar7) {
          uVar4 = 0xff;
        }
        uVar5 = 0;
        if (0 < (int)uVar7) {
          uVar5 = uVar4;
        }
        uVar4 = uVar5 + (UVar2 & 0xff);
        uVar7 = (uVar5 - 0x100) + (UVar2 & 0xff);
        if (uVar4 < 0x100) {
          uVar7 = uVar4;
        }
        *(ushort *)(puVar8 + 1) = (ushort)puVar8[1] | (ushort)(uVar7 << 8);
      }
    }
    item[2] = (ushort)puVar8[1];
    uVar4 = *puVar8;
    *(uint *)item = uVar4;
  }
  else {
    *(U16 *)(puVar8 + 1) = item[2];
    uVar4 = *(uint *)item;
    *puVar8 = uVar4;
  }
  return (ulong)uVar4;
}

Assistant:

inline void LASreadItemCompressed_RGB14_v4::read(U8* item, U32& context)
{
  // get last

  U16* last_item = contexts[current_context].last_item;

  // check for context switch

  if (current_context != context)
  {
    current_context = context; // all other items use context set by POINT14 reader
    if (contexts[current_context].unused)
    {
      createAndInitModelsAndDecompressors(current_context, (U8*)last_item);
    }
    last_item = contexts[current_context].last_item;
  }

  // decompress

  if (changed_RGB)
  {
    U8 corr;
    I32 diff = 0;
    U32 sym = dec_RGB->decodeSymbol(contexts[current_context].m_byte_used);
    if (sym & (1 << 0))
    {
      corr = dec_RGB->decodeSymbol(contexts[current_context].m_rgb_diff_0);
      ((U16*)item)[0] = (U16)U8_FOLD(corr + (last_item[0]&255));
    }
    else 
    {
      ((U16*)item)[0] = last_item[0]&0xFF;
    }
    if (sym & (1 << 1))
    {
      corr = dec_RGB->decodeSymbol(contexts[current_context].m_rgb_diff_1);
      ((U16*)item)[0] |= (((U16)U8_FOLD(corr + (last_item[0]>>8))) << 8);
    }
    else
    {
      ((U16*)item)[0] |= (last_item[0]&0xFF00);
    }
    if (sym & (1 << 6))
    {
      diff = (((U16*)item)[0]&0x00FF) - (last_item[0]&0x00FF);
      if (sym & (1 << 2))
      {
        corr = dec_RGB->decodeSymbol(contexts[current_context].m_rgb_diff_2);
        ((U16*)item)[1] = (U16)U8_FOLD(corr + U8_CLAMP(diff+(last_item[1]&255)));
      }
      else
      {
        ((U16*)item)[1] = last_item[1]&0xFF;
      }
      if (sym & (1 << 4))
      {
        corr = dec_RGB->decodeSymbol(contexts[current_context].m_rgb_diff_4);
        diff = (diff + ((((U16*)item)[1]&0x00FF) - (last_item[1]&0x00FF))) / 2;
        ((U16*)item)[2] = (U16)U8_FOLD(corr + U8_CLAMP(diff+(last_item[2]&255)));
      }
      else
      {
        ((U16*)item)[2] = last_item[2]&0xFF;
      }
      diff = (((U16*)item)[0]>>8) - (last_item[0]>>8);
      if (sym & (1 << 3))
      {
        corr = dec_RGB->decodeSymbol(contexts[current_context].m_rgb_diff_3);
        ((U16*)item)[1] |= (((U16)U8_FOLD(corr + U8_CLAMP(diff+(last_item[1]>>8))))<<8);
      }
      else
      {
        ((U16*)item)[1] |= (last_item[1]&0xFF00);
      }
      if (sym & (1 << 5))
      {
        corr = dec_RGB->decodeSymbol(contexts[current_context].m_rgb_diff_5);
        diff = (diff + ((((U16*)item)[1]>>8) - (last_item[1]>>8))) / 2;
        ((U16*)item)[2] |= (((U16)U8_FOLD(corr + U8_CLAMP(diff+(last_item[2]>>8))))<<8);
      }
      else
      {
        ((U16*)item)[2] |= (last_item[2]&0xFF00);
      }
    }
    else
    {
      ((U16*)item)[1] = ((U16*)item)[0];
      ((U16*)item)[2] = ((U16*)item)[0];
    }
    memcpy(last_item, item, 6);
  }
  else
  {
    memcpy(item, last_item, 6);
  }
}